

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

void link_frame_received(void *context,AMQP_VALUE performative,uint32_t payload_size,
                        uchar *payload_bytes)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  AMQP_VALUE pAVar5;
  LOGGER_LOG p_Var6;
  code *pcVar7;
  void *pvVar8;
  LIST_ITEM_HANDLE item_handle;
  LIST_ITEM_HANDLE pLVar9;
  ASYNC_OPERATION_HANDLE async_operation;
  undefined8 uVar10;
  undefined8 uVar11;
  char *pcVar12;
  size_t __size;
  ulong __n;
  _Bool settled;
  ATTACH_HANDLE attach_handle;
  delivery_number rcv_delivery_count;
  uint32_t rcv_link_credit;
  delivery_number last;
  _Bool local_49;
  ATTACH_HANDLE local_48;
  AMQP_VALUE local_40;
  uint local_38;
  uint local_34;
  
  __n = (ulong)payload_size;
  pAVar5 = amqpvalue_get_inplace_descriptor(performative);
  _Var2 = is_attach_type_by_descriptor(pAVar5);
  if (_Var2) {
    iVar3 = amqpvalue_get_attach(performative,&local_48);
    if (iVar3 != 0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar12 = "Cannot get attach performative";
      iVar3 = 0x148;
      goto LAB_00112204;
    }
    if ((*(char *)((long)context + 0x44) == '\x01') &&
       (iVar3 = attach_get_initial_delivery_count(local_48,(sequence_no *)((long)context + 0x40)),
       iVar3 != 0)) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"link_frame_received",0x14f,1,"Cannot get initial delivery count");
      }
      remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
      *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 8);
      *(undefined4 *)((long)context + 8) = 1;
      pcVar7 = *(code **)((long)context + 0x48);
      if (pcVar7 == (code *)0x0) goto LAB_0011225f;
      uVar11 = *(undefined8 *)((long)context + 0x60);
      uVar10 = 1;
    }
    else {
      iVar3 = attach_get_max_message_size(local_48,(uint64_t *)((long)context + 0x78));
      if ((iVar3 != 0) && (p_Var6 = xlogging_get_log_function(), p_Var6 != (LOGGER_LOG)0x0)) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"link_frame_received",0x157,1,
                  "Could not retrieve peer_max_message_size from attach frame");
      }
      if (1 < *(int *)((long)context + 8) - 1U) goto LAB_0011225f;
      if (*(char *)((long)context + 0x44) == '\x01') {
        *(undefined4 *)((long)context + 0x80) = *(undefined4 *)((long)context + 0x84);
        send_flow((LINK_INSTANCE *)context);
      }
      else {
        *(undefined4 *)((long)context + 0x80) = 0;
      }
      *(int *)((long)context + 0xc) = *(int *)((long)context + 8);
      if (*(int *)((long)context + 8) == 1) {
        *(undefined4 *)((long)context + 8) = 3;
        pcVar7 = *(code **)((long)context + 0x48);
        if (pcVar7 == (code *)0x0) goto LAB_0011225f;
        uVar11 = *(undefined8 *)((long)context + 0x60);
        uVar10 = 3;
      }
      else {
        *(undefined4 *)((long)context + 8) = 4;
        pcVar7 = *(code **)((long)context + 0x48);
        if (pcVar7 == (code *)0x0) goto LAB_0011225f;
        uVar11 = *(undefined8 *)((long)context + 0x60);
        uVar10 = 4;
      }
    }
    (*pcVar7)(uVar11,uVar10);
LAB_0011225f:
    attach_destroy(local_48);
    return;
  }
  _Var2 = is_flow_type_by_descriptor(pAVar5);
  if (!_Var2) {
    _Var2 = is_transfer_type_by_descriptor(pAVar5);
    if (_Var2) {
      if (*(long *)((long)context + 0x58) == 0) {
        return;
      }
      iVar3 = amqpvalue_get_transfer(performative,(TRANSFER_HANDLE *)&local_48);
      if (iVar3 == 0) {
        if (*(uint *)((long)context + 0x80) < 2) {
          *(undefined4 *)((long)context + 0x80) = *(undefined4 *)((long)context + 0x84);
          send_flow((LINK_INSTANCE *)context);
        }
        local_40 = (AMQP_VALUE)((ulong)local_40 & 0xffffffffffffff00);
        transfer_get_more((TRANSFER_HANDLE)local_48,(_Bool *)&local_40);
        iVar3 = transfer_get_delivery_id
                          ((TRANSFER_HANDLE)local_48,(delivery_number *)((long)context + 0xac));
        if ((iVar3 == 0) || (*(int *)((long)context + 0xa8) != 0)) {
          if (((ulong)*(uint *)((long)context + 0xa8) != 0) || ((char)local_40 == '\x01')) {
            __size = *(uint *)((long)context + 0xa8) + __n;
            pvVar8 = realloc(*(void **)((long)context + 0xa0),__size);
            if (pvVar8 == (void *)0x0) {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                          ,"link_frame_received",0x1ca,1,
                          "Could not allocate memory for the received payload, size:%zu",__size);
              }
            }
            else {
              *(void **)((long)context + 0xa0) = pvVar8;
              uVar1 = *(uint *)((long)context + 0xa8);
              memcpy((void *)((long)pvVar8 + (ulong)uVar1),payload_bytes,__n);
              *(uint *)((long)context + 0xa8) = uVar1 + payload_size;
            }
          }
          if ((char)local_40 == '\0') {
            *(int *)((long)context + 0x80) = *(int *)((long)context + 0x80) + -1;
            *(int *)((long)context + 0x40) = *(int *)((long)context + 0x40) + 1;
            if (*(uint *)((long)context + 0xa8) != 0) {
              payload_bytes = *(uchar **)((long)context + 0xa0);
              __n = (ulong)*(uint *)((long)context + 0xa8);
            }
            pAVar5 = (AMQP_VALUE)
                     (**(code **)((long)context + 0x58))
                               (*(undefined8 *)((long)context + 0x60),local_48,__n,payload_bytes);
            if (*(int *)((long)context + 0xa8) != 0) {
              free(*(void **)((long)context + 0xa0));
              *(undefined8 *)((long)context + 0xa0) = 0;
              *(undefined4 *)((long)context + 0xa8) = 0;
            }
            if (pAVar5 != (AMQP_VALUE)0x0) {
              iVar3 = send_disposition((LINK_INSTANCE *)context,
                                       *(delivery_number *)((long)context + 0xac),pAVar5);
              if ((iVar3 != 0) && (p_Var6 = xlogging_get_log_function(), p_Var6 != (LOGGER_LOG)0x0))
              {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                          ,"link_frame_received",500,1,"Cannot send disposition frame");
              }
              amqpvalue_destroy(pAVar5);
            }
          }
        }
        else {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                      ,"link_frame_received",0x1bb,1,
                      "Could not get the delivery Id from the transfer performative");
          }
        }
        transfer_destroy((TRANSFER_HANDLE)local_48);
        return;
      }
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar12 = "Cannot get transfer performative";
      iVar3 = 0x1a3;
LAB_00112204:
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_frame_received",iVar3,1,pcVar12);
      return;
    }
    _Var2 = is_disposition_type_by_descriptor(pAVar5);
    if (_Var2) {
      iVar3 = amqpvalue_get_disposition(performative,(DISPOSITION_HANDLE *)&local_48);
      if (iVar3 == 0) {
        iVar3 = disposition_get_first((DISPOSITION_HANDLE)local_48,&local_38);
        if (iVar3 == 0) {
          iVar3 = disposition_get_last((DISPOSITION_HANDLE)local_48,&local_34);
          if (iVar3 != 0) {
            local_34 = local_38;
          }
          iVar3 = disposition_get_settled((DISPOSITION_HANDLE)local_48,&local_49);
          if (iVar3 != 0) {
            local_49 = false;
          }
          if ((local_49 == true) &&
             (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38) != (SINGLYLINKEDLIST_HANDLE)0x0)) {
            item_handle = singlylinkedlist_get_head_item
                                    (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38));
            do {
              if (item_handle == (LIST_ITEM_HANDLE)0x0) break;
              pLVar9 = singlylinkedlist_get_next_item(item_handle);
              async_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(item_handle)
              ;
              if (async_operation == (ASYNC_OPERATION_HANDLE)0x0) {
                p_Var6 = xlogging_get_log_function();
                iVar3 = 0x1b;
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  (*p_Var6)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                            ,"link_frame_received",0x228,1,"Cannot obtain pending delivery");
                }
              }
              else {
                if ((local_38 <= *(uint *)&async_operation[1].async_operation_cancel_handler) &&
                   (*(uint *)&async_operation[1].async_operation_cancel_handler <= local_34)) {
                  iVar3 = disposition_get_state((DISPOSITION_HANDLE)local_48,&local_40);
                  if (iVar3 == 0) {
                    (*async_operation[2].async_operation_cancel_handler)
                              ((ASYNC_OPERATION_HANDLE)
                               async_operation[3].async_operation_cancel_handler);
                    async_operation_destroy(async_operation);
                  }
                  else {
                    p_Var6 = xlogging_get_log_function();
                    if (p_Var6 != (LOGGER_LOG)0x0) {
                      (*p_Var6)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                ,"link_frame_received",0x239,1,
                                "Failed getting the disposition state");
                    }
                  }
                  iVar4 = singlylinkedlist_remove
                                    (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38),item_handle)
                  ;
                  if (iVar4 == 0) {
                    iVar3 = 0;
                  }
                  else {
                    p_Var6 = xlogging_get_log_function();
                    iVar3 = 0x1b;
                    if (p_Var6 != (LOGGER_LOG)0x0) {
                      (*p_Var6)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                ,"link_frame_received",0x23e,1,"Cannot remove pending delivery");
                    }
                  }
                  if (iVar4 != 0) goto LAB_00112602;
                }
                iVar3 = 0;
                item_handle = pLVar9;
              }
LAB_00112602:
            } while (iVar3 == 0);
          }
        }
        else {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                      ,"link_frame_received",0x20e,1,"Cannot get first field");
          }
        }
        disposition_destroy((DISPOSITION_HANDLE)local_48);
        return;
      }
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar12 = "Cannot get disposition performative";
      iVar3 = 0x205;
      goto LAB_00112204;
    }
    _Var2 = is_detach_type_by_descriptor(pAVar5);
    if (!_Var2) {
      return;
    }
    iVar3 = amqpvalue_get_detach(performative,(DETACH_HANDLE *)&local_48);
    if (iVar3 != 0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar12 = "Cannot get detach performative";
      iVar3 = 0x253;
      goto LAB_00112204;
    }
    local_38 = local_38 & 0xffffff00;
    detach_get_closed((DETACH_HANDLE)local_48,(_Bool *)&local_38);
    if (*(uint *)((long)context + 8) == 4) {
      iVar3 = send_detach((LINK_INSTANCE *)context,local_38._0_1_,(ERROR_HANDLE)0x0);
      if ((iVar3 == 0) || (p_Var6 = xlogging_get_log_function(), p_Var6 == (LOGGER_LOG)0x0))
      goto LAB_00112804;
      iVar3 = 0x262;
    }
    else {
      if (((*(uint *)((long)context + 8) & 0xfffffffe) != 2 || local_38._0_1_ != true) ||
         (*(char *)((long)context + 0x99) != '\0')) goto LAB_00112804;
      iVar3 = send_attach((LINK_INSTANCE *)context,*(char **)((long)context + 0x30),
                          (uint)*(byte *)((long)context + 0x44),false);
      if ((iVar3 != 0) && (p_Var6 = xlogging_get_log_function(), p_Var6 != (LOGGER_LOG)0x0)) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"link_frame_received",0x26e,1,"Failed sending attach frame");
      }
      iVar3 = send_detach((LINK_INSTANCE *)context,true,(ERROR_HANDLE)0x0);
      if ((iVar3 == 0) || (p_Var6 = xlogging_get_log_function(), p_Var6 == (LOGGER_LOG)0x0))
      goto LAB_00112804;
      iVar3 = 0x273;
    }
    (*p_Var6)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
              "link_frame_received",iVar3,1,"Failed sending detach frame");
LAB_00112804:
    iVar3 = detach_get_error((DETACH_HANDLE)local_48,(ERROR_HANDLE *)&local_40);
    if (iVar3 != 0) {
      local_40 = (AMQP_VALUE)0x0;
    }
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    if (*(code **)((long)context + 0xb8) != (code *)0x0) {
      (**(code **)((long)context + 0xb8))(*(undefined8 *)((long)context + 0xc0),local_40);
    }
    *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 8);
    if (local_40 == (AMQP_VALUE)0x0) {
      *(undefined4 *)((long)context + 8) = 1;
      if (*(code **)((long)context + 0x48) != (code *)0x0) {
        (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x60),1);
      }
    }
    else {
      *(undefined4 *)((long)context + 8) = 5;
      if (*(code **)((long)context + 0x48) != (code *)0x0) {
        (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x60),5);
      }
      error_destroy((ERROR_HANDLE)local_40);
    }
    detach_destroy((DETACH_HANDLE)local_48);
    return;
  }
  iVar3 = amqpvalue_get_flow(performative,(FLOW_HANDLE *)&local_48);
  if (iVar3 != 0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar12 = "Cannot get flow performative";
    iVar3 = 0x17a;
    goto LAB_00112204;
  }
  if (*(char *)((long)context + 0x44) != '\0') goto LAB_001123ef;
  iVar3 = flow_get_link_credit((FLOW_HANDLE)local_48,&local_38);
  if (iVar3 == 0) {
    iVar3 = flow_get_delivery_count((FLOW_HANDLE)local_48,(sequence_no *)&local_40);
    if (iVar3 == 0) {
      iVar3 = (local_38 + (int)local_40) - *(int *)((long)context + 0x40);
      *(int *)((long)context + 0x80) = iVar3;
      if (iVar3 != 0) {
        (**(code **)((long)context + 0x50))(*(undefined8 *)((long)context + 0x60));
      }
      goto LAB_001123ef;
    }
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      pcVar12 = "Cannot get delivery count";
      iVar3 = 0x18b;
      goto LAB_001123b6;
    }
  }
  else {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      pcVar12 = "Cannot get link credit";
      iVar3 = 0x185;
LAB_001123b6:
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_frame_received",iVar3,1,pcVar12);
    }
  }
  remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
  *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 8);
  *(undefined4 *)((long)context + 8) = 1;
  if (*(code **)((long)context + 0x48) != (code *)0x0) {
    (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x60),1);
  }
LAB_001123ef:
  flow_destroy((FLOW_HANDLE)local_48);
  return;
}

Assistant:

static void link_frame_received(void* context, AMQP_VALUE performative, uint32_t payload_size, const unsigned char* payload_bytes)
{
    LINK_INSTANCE* link_instance = (LINK_INSTANCE*)context;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

    if (is_attach_type_by_descriptor(descriptor))
    {
        ATTACH_HANDLE attach_handle;

        if (amqpvalue_get_attach(performative, &attach_handle) != 0)
        {
            LogError("Cannot get attach performative");
        }
        else
        {
            if ((link_instance->role == role_receiver) &&
                (attach_get_initial_delivery_count(attach_handle, &link_instance->delivery_count) != 0))
            {
                LogError("Cannot get initial delivery count");
                remove_all_pending_deliveries(link_instance, true);
                set_link_state(link_instance, LINK_STATE_DETACHED);
            }
            else
            {
                if (attach_get_max_message_size(attach_handle, &link_instance->peer_max_message_size) != 0)
                {
                    LogError("Could not retrieve peer_max_message_size from attach frame");
                }

                if ((link_instance->link_state == LINK_STATE_DETACHED) ||
                    (link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_SENT))
                {
                    if (link_instance->role == role_receiver)
                    {
                        link_instance->current_link_credit = link_instance->max_link_credit;
                        send_flow(link_instance);
                    }
                    else
                    {
                        link_instance->current_link_credit = 0;
                    }

                    if (link_instance->link_state == LINK_STATE_DETACHED)
                    {
                        set_link_state(link_instance, LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED);
                    }
                    else
                    {
                        set_link_state(link_instance, LINK_STATE_ATTACHED);
                    }
                }
            }

            attach_destroy(attach_handle);
        }
    }
    else if (is_flow_type_by_descriptor(descriptor))
    {
        FLOW_HANDLE flow_handle;
        if (amqpvalue_get_flow(performative, &flow_handle) != 0)
        {
            LogError("Cannot get flow performative");
        }
        else
        {
            if (link_instance->role == role_sender)
            {
                delivery_number rcv_delivery_count;
                uint32_t rcv_link_credit;

                if (flow_get_link_credit(flow_handle, &rcv_link_credit) != 0)
                {
                    LogError("Cannot get link credit");
                    remove_all_pending_deliveries(link_instance, true);
                    set_link_state(link_instance, LINK_STATE_DETACHED);
                }
                else if (flow_get_delivery_count(flow_handle, &rcv_delivery_count) != 0)
                {
                    LogError("Cannot get delivery count");
                    remove_all_pending_deliveries(link_instance, true);
                    set_link_state(link_instance, LINK_STATE_DETACHED);
                }
                else
                {
                    link_instance->current_link_credit = rcv_delivery_count + rcv_link_credit - link_instance->delivery_count;
                    if (link_instance->current_link_credit > 0)
                    {
                        link_instance->on_link_flow_on(link_instance->callback_context);
                    }
                }
            }

            flow_destroy(flow_handle);
        }
    }
    else if (is_transfer_type_by_descriptor(descriptor))
    {
        if (link_instance->on_transfer_received != NULL)
        {
            TRANSFER_HANDLE transfer_handle;
            if (amqpvalue_get_transfer(performative, &transfer_handle) != 0)
            {
                LogError("Cannot get transfer performative");
            }
            else
            {
                AMQP_VALUE delivery_state;
                bool more;
                bool is_error;

                if (link_instance->current_link_credit <= RECEIVER_MIN_LINK_CREDIT)
                {
                    link_instance->current_link_credit = link_instance->max_link_credit;
                    send_flow(link_instance);
                }

                more = false;
                /* Attempt to get more flag, default to false */
                (void)transfer_get_more(transfer_handle, &more);
                is_error = false;

                if (transfer_get_delivery_id(transfer_handle, &link_instance->received_delivery_id) != 0)
                {
                    /* is this not a continuation transfer? */
                    if (link_instance->received_payload_size == 0)
                    {
                        LogError("Could not get the delivery Id from the transfer performative");
                        is_error = true;
                    }
                }

                if (!is_error)
                {
                    /* If this is a continuation transfer or if this is the first chunk of a multi frame transfer */
                    if ((link_instance->received_payload_size > 0) || more)
                    {
                        unsigned char* new_received_payload;;
                        size_t realloc_size = safe_add_size_t((size_t)link_instance->received_payload_size, payload_size);
                        if (realloc_size == SIZE_MAX ||
                            (new_received_payload = (unsigned char*)realloc(link_instance->received_payload, realloc_size)) == NULL)
                        {
                            LogError("Could not allocate memory for the received payload, size:%zu", realloc_size);
                        }
                        else
                        {
                            link_instance->received_payload = new_received_payload;
                            (void)memcpy(link_instance->received_payload + link_instance->received_payload_size, payload_bytes, payload_size);
                            link_instance->received_payload_size += payload_size;
                        }
                    }

                    if (!more)
                    {
                        const unsigned char* indicate_payload_bytes;
                        uint32_t indicate_payload_size;

                        link_instance->current_link_credit--;
                        link_instance->delivery_count++;
                        /* if no previously stored chunks then simply report the current payload */
                        if (link_instance->received_payload_size > 0)
                        {
                            indicate_payload_size = link_instance->received_payload_size;
                            indicate_payload_bytes = link_instance->received_payload;
                        }
                        else
                        {
                            indicate_payload_size = payload_size;
                            indicate_payload_bytes = payload_bytes;
                        }

                        delivery_state = link_instance->on_transfer_received(link_instance->callback_context, transfer_handle, indicate_payload_size, indicate_payload_bytes);

                        if (link_instance->received_payload_size > 0)
                        {
                            free(link_instance->received_payload);
                            link_instance->received_payload = NULL;
                            link_instance->received_payload_size = 0;
                        }

                        if (delivery_state != NULL)
                        {
                            if (send_disposition(link_instance, link_instance->received_delivery_id, delivery_state) != 0)
                            {
                                LogError("Cannot send disposition frame");
                            }

                            amqpvalue_destroy(delivery_state);
                        }
                    }
                }

                transfer_destroy(transfer_handle);
            }
        }
    }
    else if (is_disposition_type_by_descriptor(descriptor))
    {
        DISPOSITION_HANDLE disposition;
        if (amqpvalue_get_disposition(performative, &disposition) != 0)
        {
            LogError("Cannot get disposition performative");
        }
        else
        {
            delivery_number first;
            delivery_number last;

            if (disposition_get_first(disposition, &first) != 0)
            {
                LogError("Cannot get first field");
            }
            else
            {
                bool settled;

                if (disposition_get_last(disposition, &last) != 0)
                {
                    last = first;
                }

                if (disposition_get_settled(disposition, &settled) != 0)
                {
                    settled = false;
                }

                if (settled && 
                    link_instance->pending_deliveries != NULL)
                {
                    LIST_ITEM_HANDLE pending_delivery = singlylinkedlist_get_head_item(link_instance->pending_deliveries);
                    while (pending_delivery != NULL)
                    {
                        LIST_ITEM_HANDLE next_pending_delivery = singlylinkedlist_get_next_item(pending_delivery);
                        ASYNC_OPERATION_HANDLE pending_delivery_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(pending_delivery);
                        if (pending_delivery_operation == NULL)
                        {
                            LogError("Cannot obtain pending delivery");
                            break;
                        }
                        else
                        {
                            DELIVERY_INSTANCE* delivery_instance = (DELIVERY_INSTANCE*)GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, pending_delivery_operation);

                            if ((delivery_instance->delivery_id >= first) && (delivery_instance->delivery_id <= last))
                            {
                                AMQP_VALUE delivery_state;
                                if (disposition_get_state(disposition, &delivery_state) == 0)
                                {
                                    delivery_instance->on_delivery_settled(delivery_instance->callback_context, delivery_instance->delivery_id, LINK_DELIVERY_SETTLE_REASON_DISPOSITION_RECEIVED, delivery_state);
                                    async_operation_destroy(pending_delivery_operation);
                                }
                                else
                                {
                                    LogError("Failed getting the disposition state");
                                }

                                if (singlylinkedlist_remove(link_instance->pending_deliveries, pending_delivery) != 0)
                                {
                                    LogError("Cannot remove pending delivery");
                                    break;
                                }
                            }

                            pending_delivery = next_pending_delivery;
                        }
                    }
                }
            }

            disposition_destroy(disposition);
        }
    }
    else if (is_detach_type_by_descriptor(descriptor))
    {
        DETACH_HANDLE detach;

        /* Set link state appropriately based on whether we received detach condition */
        if (amqpvalue_get_detach(performative, &detach) != 0)
        {
            LogError("Cannot get detach performative");
        }
        else
        {
            bool closed = false;
            ERROR_HANDLE error;

            (void)detach_get_closed(detach, &closed);

            /* Received a detach while attached */
            if (link_instance->link_state == LINK_STATE_ATTACHED)
            {
                /* Respond with ack */
                if (send_detach(link_instance, closed, NULL) != 0)
                {
                    LogError("Failed sending detach frame");
                }
            }
            /* Received a closing detach after we sent a non-closing detach. */
            else if (closed &&
                ((link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_SENT) || (link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED)) &&
                !link_instance->is_closed)
            {

                /* In this case, we MUST signal that we closed by reattaching and then sending a closing detach.*/
                if (send_attach(link_instance, link_instance->name, 0, link_instance->role) != 0)
                {
                    LogError("Failed sending attach frame");
                }

                if (send_detach(link_instance, true, NULL) != 0)
                {
                    LogError("Failed sending detach frame");
                }
            }

            if (detach_get_error(detach, &error) != 0)
            {
                error = NULL;
            }
            remove_all_pending_deliveries(link_instance, true);
            // signal link detach received in order to handle cases like redirect
            if (link_instance->on_link_detach_received_event_subscription.on_link_detach_received != NULL)
            {
                link_instance->on_link_detach_received_event_subscription.on_link_detach_received(link_instance->on_link_detach_received_event_subscription.context, error);
            }

            if (error != NULL)
            {
                set_link_state(link_instance, LINK_STATE_ERROR);
                error_destroy(error);
            }
            else
            {
                set_link_state(link_instance, LINK_STATE_DETACHED);
            }

            detach_destroy(detach);
        }
    }
}